

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

bool cmState::StringToCacheEntryType(char *s,CacheEntryType *type)

{
  char *__s2;
  int iVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = cmCacheEntryTypes[0] != (char *)0x0;
  if (bVar3) {
    iVar1 = strcmp(s,cmCacheEntryTypes[0]);
    lVar2 = 0;
    while (iVar1 != 0) {
      __s2 = cmCacheEntryTypes[lVar2 + 1];
      bVar3 = __s2 != (char *)0x0;
      if (__s2 == (char *)0x0) {
        return bVar3;
      }
      iVar1 = strcmp(s,__s2);
      lVar2 = lVar2 + 1;
    }
    *type = (CacheEntryType)lVar2;
  }
  return bVar3;
}

Assistant:

bool cmState::StringToCacheEntryType(const char* s,
                                     cmStateEnums::CacheEntryType& type)
{
  int i = 0;
  while (cmCacheEntryTypes[i]) {
    if (strcmp(s, cmCacheEntryTypes[i]) == 0) {
      type = static_cast<cmStateEnums::CacheEntryType>(i);
      return true;
    }
    ++i;
  }
  return false;
}